

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_zstd.c
# Opt level: O1

int archive_compressor_zstd_write(archive_write_filter *f,void *buff,size_t length)

{
  int64_t *piVar1;
  private_data_conflict8 *data;
  int iVar2;
  
  data = (private_data_conflict8 *)f->data;
  piVar1 = &data->total_in;
  *piVar1 = *piVar1 + length;
  iVar2 = drive_compressor(f,data,0,buff,length);
  return iVar2;
}

Assistant:

static int
archive_compressor_zstd_write(struct archive_write_filter *f, const void *buff,
    size_t length)
{
	struct private_data *data = (struct private_data *)f->data;
	int ret;

	/* Update statistics */
	data->total_in += length;

	if ((ret = drive_compressor(f, data, 0, buff, length)) != ARCHIVE_OK)
		return (ret);

	return (ARCHIVE_OK);
}